

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

Clifford * operator/(Clifford *__return_storage_ptr__,Clifford *A,Clifford *B)

{
  vector<Blade,_std::allocator<Blade>_> local_68;
  Clifford local_50;
  vector<Blade,_std::allocator<Blade>_> local_38;
  Clifford *local_20;
  Clifford *B_local;
  Clifford *A_local;
  
  local_20 = B;
  B_local = A;
  A_local = __return_storage_ptr__;
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_38,A);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_68,B);
  inverse(&local_50,&local_68);
  operator*(__return_storage_ptr__,&local_38,&local_50);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_50);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_68);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Clifford operator/(Clifford A, Clifford B)
{
	return A*inverse(B);
}